

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O0

const_reference_value __thiscall
Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_(SparseAccessor *this)

{
  bool bVar1;
  index_type __val;
  iterator iVar2;
  ostream *poVar3;
  difference_type __n;
  reference pdVar4;
  __normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_> local_138;
  __normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_> local_130;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_30;
  int *local_28;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_20;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_18;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> iter;
  SparseAccessor *this_local;
  
  iter._M_current = (int *)this;
  iVar2 = std::span<int,_18446744073709551615UL>::begin
                    ((span<int,_18446744073709551615UL> *)(*(long *)this + 0x10));
  local_20._M_current = iVar2._M_current;
  local_28 = (int *)std::span<int,_18446744073709551615UL>::end
                              ((span<int,_18446744073709551615UL> *)(*(long *)this + 0x10));
  local_18 = std::find<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>,int>
                       (local_20,(__normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_>)
                                 local_28,(int *)(this + 8));
  local_30._M_current =
       (int *)std::span<int,_18446744073709551615UL>::end
                        ((span<int,_18446744073709551615UL> *)(*(long *)this + 0x10));
  bVar1 = __gnu_cxx::operator==<int_*,_std::span<int,_18446744073709551615UL>_>(&local_18,&local_30)
  ;
  if (!bVar1) {
    local_138._M_current =
         (double *)
         std::span<double,_18446744073709551615UL>::begin
                   ((span<double,_18446744073709551615UL> *)(*(long *)this + 0x20));
    iVar2 = std::span<int,_18446744073709551615UL>::begin
                      ((span<int,_18446744073709551615UL> *)(*(long *)this + 0x10));
    __n = std::distance<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>>
                    ((__normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_>)
                     iVar2._M_current,local_18);
    local_130 = __gnu_cxx::__normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_>::
                operator+(&local_138,__n);
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_>::
             operator*(&local_130);
    return pdVar4;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_58 = &PTR_s__workspace_llm4binary_github_lic_001b9280;
  console_format_abi_cxx11_
            (&local_50,(Disa *)0x0,(Log_Level)&local_58,(source_location *)iVar2._M_current);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  __val = Matrix_Sparse_Row<double,_int>::row(*(Matrix_Sparse_Row<double,_int> **)this);
  std::__cxx11::to_string(&local_108,__val);
  std::operator+(&local_e8,"Attempting to implicitly insert an new element at (",&local_108);
  std::operator+(&local_c8,&local_e8,", ");
  std::__cxx11::to_string(&local_128,*(int *)(this + 8));
  std::operator+(&local_a8,&local_c8,&local_128);
  std::operator+(&local_88,&local_a8,") must use explicit assignment operator.");
  poVar3 = std::operator<<(poVar3,(string *)&local_88);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

[[nodiscard]] operator const_reference_value() const {
      auto iter = std::find(row_.i_column.begin(), row_.i_column.end(), i_column);
      ASSERT_DEBUG(iter != row_.i_column.end(), "Attempting to implicitly insert an new element at (" +
                                                std::to_string(row_.row()) + ", " + std::to_string(i_column) +
                                                ") must use explicit assignment operator.");
      return *(row_.value.begin() + std::distance(row_.i_column.begin(), iter));
    }